

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool __thiscall pbrt::Image::WritePFM(Image *this,string *filename,ImageMetadata *metadata)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  void *__s;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  bool bVar6;
  Point2i p;
  ulong uVar7;
  int c;
  Float FVar8;
  string ret;
  int vb;
  ulong local_50;
  string *local_48;
  FILE *local_40;
  ulong local_38;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&ret,"Unable to open output PFM file \"%s\"",filename);
    Error((FileLoc *)0x0,ret._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    bVar6 = false;
  }
  else {
    lVar2 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    uVar4 = 0xffffffffffffffff;
    if (-1 < lVar2) {
      uVar4 = lVar2 * 0xc;
    }
    local_48 = filename;
    __s = operator_new__(uVar4);
    memset(__s,0,uVar4);
    iVar1 = fprintf(__stream,"PF\n");
    if (((-1 < iVar1) &&
        (iVar1 = fprintf(__stream,"%d %d\n",
                         (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                         (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y),
        -1 < iVar1)) && (iVar1 = fprintf(__stream,"%f\n",0xbff0000000000000), -1 < iVar1)) {
      uVar4 = (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      local_40 = __stream;
      do {
        if ((int)uVar4 < 1) {
          fclose(__stream);
          bVar6 = true;
          goto LAB_004390a7;
        }
        iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        uVar4 = uVar4 - 1;
        if (0 < iVar1) {
          local_50 = uVar4 << 0x20;
          uVar7 = 0;
          pvVar5 = __s;
          local_38 = uVar4;
          do {
            iVar1 = (int)(this->channelNames).nStored;
            if (iVar1 == 1) {
              FVar8 = GetChannel(this,(Point2i)(local_50 | uVar7),0,(WrapMode2D)0x200000002);
              *(Float *)((long)__s + uVar7 * 0xc + 8) = FVar8;
              *(Float *)((long)__s + uVar7 * 0xc + 4) = FVar8;
              *(Float *)((long)__s + uVar7 * 0xc) = FVar8;
            }
            else {
              ret._M_dataplus._M_p._0_4_ = 3;
              if (iVar1 != 3) {
                vb = iVar1;
                LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],int&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                           ,0x630,"Check failed: %s == %s with %s = %s, %s = %s",
                           (char (*) [2])0x558341,(char (*) [12])0x6f0fae,(char (*) [2])0x558341,
                           (int *)&ret,(char (*) [12])0x6f0fae,&vb);
              }
              lVar2 = 0;
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar7);
              vb = 3;
              do {
                FVar8 = GetChannel(this,p,(int)lVar2,(WrapMode2D)0x200000002);
                *(Float *)((long)pvVar5 + lVar2 * 4) = FVar8;
                lVar2 = lVar2 + 1;
              } while (lVar2 != 3);
            }
            iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
            uVar7 = uVar7 + 1;
            pvVar5 = (void *)((long)pvVar5 + 0xc);
            uVar4 = local_38;
            __stream = local_40;
          } while ((long)uVar7 < (long)iVar1);
        }
        sVar3 = fwrite(__s,4,(long)(iVar1 * 3),__stream);
      } while ((ulong)((long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * 3) <= sVar3);
    }
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&ret,"Error writing PFM file \"%s\"",local_48);
    Error((FileLoc *)0x0,ret._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    fclose(__stream);
    bVar6 = false;
LAB_004390a7:
    operator_delete__(__s);
  }
  return bVar6;
}

Assistant:

bool Image::WritePFM(const std::string &filename, const ImageMetadata &metadata) const {
    FILE *fp = fopen(filename.c_str(), "wb");
    if (fp == nullptr) {
        Error("Unable to open output PFM file \"%s\"", filename);
        return false;
    }

    std::unique_ptr<float[]> scanline = std::make_unique<float[]>(3 * resolution.x);
    float scale;

    // only write 3 channel PFMs here...
    if (fprintf(fp, "PF\n") < 0)
        goto fail;

    // write the width and height, which must be positive
    if (fprintf(fp, "%d %d\n", resolution.x, resolution.y) < 0)
        goto fail;

    // write the scale, which encodes endianness
    scale = hostLittleEndian ? -1.f : 1.f;
    if (fprintf(fp, "%f\n", scale) < 0)
        goto fail;

    // write the data from bottom left to upper right as specified by
    // http://netpbm.sourceforge.net/doc/pfm.html
    // The raster is a sequence of pixels, packed one after another, with no
    // delimiters of any kind. They are grouped by row, with the pixels in each
    // row ordered left to right and the rows ordered bottom to top.
    for (int y = resolution.y - 1; y >= 0; y--) {
        for (int x = 0; x < resolution.x; ++x) {
            if (NChannels() == 1) {
                Float v = GetChannel({x, y}, 0);
                scanline[3 * x] = scanline[3 * x + 1] = scanline[3 * x + 2] = v;
            } else {
                CHECK_EQ(3, NChannels());
                for (int c = 0; c < 3; ++c)
                    // Assign element-wise in case Float is typedefed as
                    // 'double'.
                    scanline[3 * x + c] = GetChannel({x, y}, c);
            }
        }
        if (fwrite(&scanline[0], sizeof(float), 3 * resolution.x, fp) <
            (size_t)(3 * resolution.x))
            goto fail;
    }

    fclose(fp);
    return true;

fail:
    Error("Error writing PFM file \"%s\"", filename);
    fclose(fp);
    return false;
}